

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O2

void __thiscall
wasm::SuffixTree::RepeatedSubstringIterator::advance(RepeatedSubstringIterator *this)

{
  pointer ppSVar1;
  SuffixTreeInternalNode *this_00;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ret_type this_01;
  iterator __begin2;
  __node_base *p_Var6;
  pointer puVar7;
  iterator __end2;
  pointer puStack_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> RepeatedSubstringStarts;
  ret_type local_38;
  SuffixTreeInternalNode *InternalChild;
  
  RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puStack_68 = (pointer)0x0;
  RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  RepeatedSubstring::operator=(&this->RS,(RepeatedSubstring *)&stack0xffffffffffffff98);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&RepeatedSubstringStarts.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  this->N = (SuffixTreeNode *)0x0;
  RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puStack_68 = (pointer)0x0;
  RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  do {
    do {
      ppSVar1 = (this->InternalNodesToVisit).
                super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->InternalNodesToVisit).
          super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start == ppSVar1) goto LAB_00c89906;
      if (RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != puStack_68) {
        RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = puStack_68;
      }
      this_00 = ppSVar1[-1];
      (this->InternalNodesToVisit).
      super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppSVar1 + -1;
      uVar4 = SuffixTreeNode::getConcatLen(&this_00->super_SuffixTreeNode);
      p_Var6 = &(this_00->Children)._M_h._M_before_begin;
      while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
        local_38 = llvm::dyn_cast<wasm::SuffixTreeInternalNode,wasm::SuffixTreeNode>
                             (*(SuffixTreeNode **)
                               &((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor);
        if (local_38 == (ret_type)0x0) {
          if (this->MinLength <= uVar4) {
            this_01 = llvm::cast<wasm::SuffixTreeLeafNode,wasm::SuffixTreeNode>
                                (*(SuffixTreeNode **)
                                  &((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor);
            uVar5 = SuffixTreeLeafNode::getSuffixIdx(this_01);
            local_38 = (ret_type)CONCAT44(local_38._4_4_,uVar5);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &stack0xffffffffffffff98,(uint *)&local_38);
          }
        }
        else {
          std::
          vector<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>::
          push_back(&this->InternalNodesToVisit,&local_38);
        }
      }
      bVar3 = SuffixTreeInternalNode::isRoot(this_00);
      puVar2 = RepeatedSubstringStarts.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (bVar3);
  } while ((ulong)((long)RepeatedSubstringStarts.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start - (long)puStack_68) < 5);
  this->N = &this_00->super_SuffixTreeNode;
  (this->RS).Length = uVar4;
  for (puVar7 = puStack_68; puVar7 != puVar2; puVar7 = puVar7 + 1) {
    local_38 = (ret_type)CONCAT44(local_38._4_4_,*puVar7);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&(this->RS).StartIndices,(value_type_conflict2 *)&local_38);
  }
LAB_00c89906:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffff98);
  return;
}

Assistant:

void SuffixTree::RepeatedSubstringIterator::advance() {
  // Clear the current state. If we're at the end of the range, then this
  // is the state we want to be in.
  RS = RepeatedSubstring();
  N = nullptr;

  // Each leaf node represents a repeat of a string.
  std::vector<unsigned> RepeatedSubstringStarts;

  // Continue visiting nodes until we find one which repeats more than once.
  while (!InternalNodesToVisit.empty()) {
    RepeatedSubstringStarts.clear();
    auto* Curr = InternalNodesToVisit.back();
    InternalNodesToVisit.pop_back();

    // Keep track of the length of the string associated with the node. If
    // it's too short, we'll quit.
    unsigned Length = Curr->getConcatLen();

    // Iterate over each child, saving internal nodes for visiting, and
    // leaf nodes in LeafChildren. Internal nodes represent individual
    // strings, which may repeat.
    for (auto& ChildPair : Curr->Children) {
      // Save all of this node's children for processing.
      if (auto* InternalChild =
            dyn_cast<SuffixTreeInternalNode>(ChildPair.second)) {
        InternalNodesToVisit.push_back(InternalChild);
        continue;
      }

      if (Length < MinLength) {
        continue;
      }

      // Have an occurrence of a potentially repeated string. Save it.
      auto* Leaf = cast<SuffixTreeLeafNode>(ChildPair.second);
      RepeatedSubstringStarts.push_back(Leaf->getSuffixIdx());
    }

    // The root never represents a repeated substring. If we're looking at
    // that, then skip it.
    if (Curr->isRoot()) {
      continue;
    }

    // Do we have any repeated substrings?
    if (RepeatedSubstringStarts.size() < 2) {
      continue;
    }

    // Yes. Update the state to reflect this, and then bail out.
    N = Curr;
    RS.Length = Length;
    for (unsigned StartIdx : RepeatedSubstringStarts) {
      RS.StartIndices.push_back(StartIdx);
    }
    break;
  }
  // At this point, either NewRS is an empty RepeatedSubstring, or it was
  // set in the above loop. Similarly, N is either nullptr, or the node
  // associated with NewRS.
}